

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O2

void bov_text_draw(bov_window_t *window,bov_text_t *text)

{
  if (text->vboLen != 0) {
    if (window->last_program != 0) {
      (*glad_glUseProgram)(window->program[0]);
      window->last_program = 0;
    }
    (*glad_glBindBuffer)(0x8a11,window->ubo[1]);
    (*glad_glBufferSubData)(0x8a11,0,0x40,&text->param);
    (*glad_glBindVertexArray)(text->vao);
    (*glad_glDrawArrays)(4,0,text->vboLen * 6);
    return;
  }
  return;
}

Assistant:

void bov_text_draw(bov_window_t* window, const bov_text_t* text)
{
	if(text->vboLen==0)
		return;

	if(window->last_program!=TEXT_PROGRAM_INDEX) {
		glUseProgram(window->program[TEXT_PROGRAM_INDEX]);
		window->last_program = TEXT_PROGRAM_INDEX;
	}

	// update the object ubo
	glBindBuffer(GL_UNIFORM_BUFFER, window->ubo[1]);
	glBufferSubData(GL_UNIFORM_BUFFER,
	                0,
	                sizeof(bov_text_param_t),
	                &text->param);
	// glBindBuffer(GL_UNIFORM_BUFFER, 0);

	glBindVertexArray(text->vao);
	glDrawArrays(GL_TRIANGLES, 0, text->vboLen * 6);
	// glBindVertexArray(0);
}